

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

base_learner * cbify_setup(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  typed_option<float> *ptVar4;
  uint64_t uVar5;
  base_learner *pbVar6;
  multi_learner *base;
  learner<cbify,_example> *plVar7;
  single_learner *base_00;
  float fVar8;
  float fVar9;
  bool use_cs;
  free_ptr<cbify> data;
  uint32_t num_actions;
  allocator local_4f0;
  allocator local_4ef;
  allocator local_4ee;
  allocator local_4ed;
  allocator local_4ec;
  allocator local_4eb;
  allocator local_4ea;
  allocator local_4e9;
  undefined1 local_4e8 [160];
  string local_448 [32];
  string local_428;
  string local_408 [32];
  string local_3e8;
  string local_3c8 [32];
  string local_3a8;
  string local_388 [32];
  string local_368;
  string local_348;
  stringstream ss;
  undefined1 local_318 [32];
  string local_2f8 [64];
  bool local_2b8;
  option_group_definition new_options;
  typed_option<float> local_168;
  typed_option<float> local_c8;
  
  num_actions = 0;
  scoped_calloc_or_throw<cbify>();
  std::__cxx11::string::string
            ((string *)&local_348,"Make Multiclass into Contextual Bandit",(allocator *)&ss);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string((string *)&local_368,"cbify",&local_4e9);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&ss,&local_368,&num_actions);
  local_2b8 = true;
  std::__cxx11::string::string
            (local_388,"Convert multiclass on <k> classes into a contextual bandit problem",
             &local_4ea);
  std::__cxx11::string::_M_assign(local_2f8);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&new_options,(typed_option<unsigned_int> *)&ss);
  std::__cxx11::string::string((string *)&local_3a8,"cbify_cs",&local_4eb);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_4e8,&local_3a8,&use_cs);
  std::__cxx11::string::string
            (local_3c8,"consume cost-sensitive classification examples instead of multiclass",
             &local_4ec);
  std::__cxx11::string::_M_assign((string *)(local_4e8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_4e8);
  std::__cxx11::string::string((string *)&local_3e8,"loss0",&local_4ed);
  VW::config::typed_option<float>::typed_option
            (&local_168,&local_3e8,
             &(data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_168,0.0);
  std::__cxx11::string::string(local_408,"loss for correct label",&local_4ee);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_428,"loss1",&local_4ef);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_428,
             &(data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_c8,1.0);
  std::__cxx11::string::string(local_448,"loss for incorrect label",&local_4f0);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4);
  std::__cxx11::string::~string(local_448);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string(local_408);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string(local_3c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_4e8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string(local_388);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&ss);
  std::__cxx11::string::~string((string *)&local_368);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&ss,"cbify",(allocator *)local_4e8);
  iVar2 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar2 == '\0') {
    plVar7 = (learner<cbify,_example> *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&ss,"cb_explore_adf",(allocator *)local_4e8);
    iVar2 = (*options->_vptr_options_i[1])(options,&ss);
    (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
    _M_head_impl)->use_adf = SUB41(iVar2,0);
    std::__cxx11::string::~string((string *)&ss);
    uVar5 = uniform_hash("vw",2,0);
    (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
    _M_head_impl)->app_seed = uVar5;
    ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
     _M_head_impl)->a_s)._begin = (action_score *)0x0;
    ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
     _M_head_impl)->a_s)._end = (action_score *)0x0;
    ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
     _M_head_impl)->a_s).end_array = (action_score *)0x0;
    ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
     _M_head_impl)->a_s).erase_count = 0;
    (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
    _M_head_impl)->all = all;
    if ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
        _M_head_impl)->use_adf == true) {
      init_adf_data(data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_cbify_*,_false>._M_head_impl,(ulong)num_actions);
    }
    std::__cxx11::string::string((string *)&ss,"cb_explore",(allocator *)local_4e8);
    iVar2 = (*options->_vptr_options_i[1])(options,&ss);
    if ((char)iVar2 == '\0') {
      bVar1 = (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->use_adf;
      std::__cxx11::string::~string((string *)&ss);
      if (bVar1 == false) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::_M_insert<unsigned_long>((ulong)local_318);
        std::__cxx11::string::string((string *)local_4e8,"cb_explore",(allocator *)&local_c8);
        std::__cxx11::stringbuf::str();
        (*options->_vptr_options_i[5])(options,local_4e8,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)local_4e8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
    }
    else {
      std::__cxx11::string::~string((string *)&ss);
    }
    if ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
        _M_head_impl)->use_adf == true) {
      std::__cxx11::string::string((string *)&ss,"cb_min_cost",(allocator *)&local_168);
      std::__cxx11::to_string
                ((string *)local_4e8,
                 (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0);
      (*options->_vptr_options_i[5])(options,&ss,local_4e8);
      std::__cxx11::string::~string((string *)local_4e8);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::string((string *)&ss,"cb_max_cost",(allocator *)&local_168);
      std::__cxx11::to_string
                ((string *)local_4e8,
                 (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1);
      (*options->_vptr_options_i[5])(options,&ss,local_4e8);
      std::__cxx11::string::~string((string *)local_4e8);
      std::__cxx11::string::~string((string *)&ss);
    }
    std::__cxx11::string::string((string *)&ss,"baseline",(allocator *)local_4e8);
    iVar2 = (*options->_vptr_options_i[1])(options,&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      fVar9 = ABS((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0);
      fVar8 = ABS((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1);
      if (fVar8 <= fVar9) {
        fVar8 = fVar9;
      }
      std::ostream::operator<<
                (local_318,
                 fVar8 / ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1 -
                         (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0));
      std::__cxx11::string::string((string *)local_4e8,"lr_multiplier",(allocator *)&local_c8);
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_4e8,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)local_4e8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    if ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
        _M_head_impl)->use_adf == true) {
      pbVar6 = setup_base(options,all);
      base = LEARNER::as_multiline<char,char>(pbVar6);
      if (use_cs == true) {
        plVar7 = LEARNER::
                 init_cost_sensitive_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                           (&data,base,predict_or_learn_adf<true,true>,
                            predict_or_learn_adf<false,true>,all->p,1,multiclass);
      }
      else {
        plVar7 = LEARNER::
                 init_multiclass_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                           (&data,base,predict_or_learn_adf<true,false>,
                            predict_or_learn_adf<false,false>,all->p,1,multiclass);
      }
    }
    else {
      pbVar6 = setup_base(options,all);
      base_00 = LEARNER::as_singleline<char,char>(pbVar6);
      if (use_cs == true) {
        plVar7 = LEARNER::init_cost_sensitive_learner<cbify,example,LEARNER::learner<char,example>>
                           (&data,base_00,predict_or_learn<true,true>,predict_or_learn<false,true>,
                            all->p,1,multiclass);
      }
      else {
        plVar7 = LEARNER::init_multiclass_learner<cbify,example,LEARNER::learner<char,example>>
                           (&data,base_00,predict_or_learn<true,false>,predict_or_learn<false,false>
                            ,all->p,1,multiclass);
      }
    }
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish;
    all->delete_prediction = (_func_void_void_ptr *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<cbify,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* cbify_setup(options_i& options, vw& all)
{
  uint32_t num_actions = 0;
  auto data = scoped_calloc_or_throw<cbify>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Contextual Bandit");
  new_options
      .add(make_option("cbify", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("cbify_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify"))
    return nullptr;

  data->use_adf = options.was_supplied("cb_explore_adf");
  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;

  if (data->use_adf)
    init_adf_data(*data.get(), num_actions);

  if (!options.was_supplied("cb_explore") && !data->use_adf)
  {
    stringstream ss;
    ss << num_actions;
    options.insert("cb_explore", ss.str());
  }

  if (data->use_adf)
  {
    options.insert("cb_min_cost", to_string(data->loss0));
    options.insert("cb_max_cost", to_string(data->loss1));
  }

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<cbify, example>* l;

  if (data->use_adf)
  {
    multi_learner* base = as_multiline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(
          data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, 1);
  }
  else
  {
    single_learner* base = as_singleline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn<true, true>, predict_or_learn<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(data, base, predict_or_learn<true, false>, predict_or_learn<false, false>, all.p, 1);
  }
  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}